

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall helics::TimeDependencies::addDependent(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference pvVar4;
  pointer pDVar5;
  BaseType in_ESI;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_RDI;
  iterator dependencyIterator;
  bool rval;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  dep;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffb0
  ;
  const_iterator in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  byte bVar6;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_18 [2];
  GlobalFederateId local_8 [2];
  
  local_8[0].gid = in_ESI;
  bVar1 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::empty
                    ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
    std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
    emplace_back<helics::GlobalFederateId&>
              ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (GlobalFederateId *)in_stack_ffffffffffffffb8._M_current);
    pvVar4 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::back
                       (in_stack_ffffffffffffffb0);
    pvVar4->dependent = true;
  }
  else {
    iVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                      (in_RDI);
    iVar3 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                      (in_RDI);
    local_18[0] = std::
                  lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                            (iVar2._M_current,iVar3._M_current,local_8);
    std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end(in_RDI);
    bVar1 = __gnu_cxx::
            operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_RDI);
    if (bVar1) {
      std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
      emplace_back<helics::GlobalFederateId&>
                ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (GlobalFederateId *)in_stack_ffffffffffffffb8._M_current);
      pvVar4 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::back
                         (in_stack_ffffffffffffffb0);
      pvVar4->dependent = true;
    }
    else {
      pDVar5 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->(local_18);
      bVar1 = GlobalFederateId::operator==(&pDVar5->fedID,local_8[0]);
      if (bVar1) {
        pDVar5 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18);
        bVar6 = pDVar5->dependent & 1;
        pDVar5 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18);
        pDVar5->dependent = true;
        return (bool)((bVar6 ^ 0xff) & 1);
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>
      ::__normal_iterator<helics::DependencyInfo*>
                ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)in_stack_ffffffffffffffb0,
                 (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)in_RDI);
      std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
      emplace<helics::GlobalFederateId&>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,(GlobalFederateId *)in_RDI);
      pDVar5 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)&stack0xffffffffffffffb8);
      pDVar5->dependent = true;
    }
  }
  return true;
}

Assistant:

bool TimeDependencies::addDependent(GlobalFederateId gid)

{
    if (dependencies.empty()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependent = true;
        return true;
    }
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep == dependencies.end()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependent = true;
    } else {
        if (dep->fedID == gid) {
            auto rval = dep->dependent;
            dep->dependent = true;
            // the dependency is already present
            return !rval;
        }
        auto dependencyIterator = dependencies.emplace(dep, gid);
        dependencyIterator->dependent = true;
    }
    return true;
}